

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall
doublechecked::Roaring64Map::removeRange(Roaring64Map *this,uint64_t min,uint64_t max)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  const_iterator __last;
  const_iterator __first;
  
  if (min < max) {
    roaring::Roaring64Map::removeRangeClosed(&this->plain,min,max - 1);
    __last._M_node = &(this->check)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __first._M_node = __last._M_node;
    for (p_Var1 = p_Var2; p_Var1 != (_Base_ptr)0x0;
        p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < min]) {
      if (*(ulong *)(p_Var1 + 1) >= min) {
        __first._M_node = p_Var1;
      }
    }
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < max]) {
      if (*(ulong *)(p_Var2 + 1) >= max) {
        __last._M_node = p_Var2;
      }
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase_aux(&(this->check)._M_t,__first,__last);
    return;
  }
  return;
}

Assistant:

void removeRange(uint64_t min, uint64_t max) {
        if (min >= max) {
            return;
        }
        return removeRangeClosed(min, max - 1);
    }